

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_tweak_item(command *cmd)

{
  bitflag bVar1;
  uint16_t uVar2;
  object *poVar3;
  loc lVar4;
  _Bool _Var5;
  wchar_t wVar6;
  ego_item *peVar7;
  artifact *art;
  ego_item *e;
  long lVar8;
  char **ppcVar9;
  object *obj;
  wchar_t val;
  wchar_t update;
  object *local_e8;
  object *poStack_e0;
  char tmp_val [80];
  char prompt [80];
  
  update = L'\0';
  wVar6 = cmd_get_arg_item((command_conflict *)cmd,"item",&obj);
  if (wVar6 != L'\0') {
    _Var5 = get_item(&obj,"Tweak which item? ","You have nothing to tweak.",cmd->code,
                     (item_tester)0x0,L'\x0f');
    if (!_Var5) {
      return;
    }
    cmd_set_arg_item((command_conflict *)cmd,"item",obj);
  }
  if (obj->artifact != (artifact *)0x0) {
    return;
  }
  wVar6 = cmd_get_arg_choice((command_conflict *)cmd,"update",&update);
  if (wVar6 != L'\0') {
    update = L'\x01';
  }
  if (obj->ego == (ego_item *)0x0) {
    strnfmt(tmp_val,0x50,"-1");
  }
  else {
    strnfmt(tmp_val,0x50,"%s",obj->ego->name);
  }
  _Var5 = get_string("Enter ego item: ",tmp_val,0x50);
  if (!_Var5) {
    return;
  }
  _Var5 = get_int_from_string(tmp_val,&val);
  if (_Var5) {
    if ((-1 < (long)val) && ((uint)val < (uint)z_info->e_max)) {
      peVar7 = e_info + val;
      goto LAB_00135874;
    }
    obj->ego = (ego_item *)0x0;
  }
  else {
    peVar7 = lookup_ego_item(tmp_val,(uint)obj->tval,(uint)obj->sval);
LAB_00135874:
    obj->ego = peVar7;
    if (peVar7 != (ego_item *)0x0) {
      poVar3 = obj->known;
      uVar2 = obj->oidx;
      lVar4 = obj->grid;
      bVar1 = obj->notice;
      local_e8 = obj->prev;
      poStack_e0 = obj->next;
      object_prep(obj,obj->kind,(int)player->depth,RANDOMISE);
      obj->ego = peVar7;
      obj->prev = local_e8;
      obj->next = poStack_e0;
      obj->known = poVar3;
      obj->oidx = uVar2;
      obj->grid = lVar4;
      obj->notice = bVar1;
      ego_apply_magic(obj,(int)player->depth,RANDOMISE);
    }
  }
  wiz_display_item(obj,true,player);
  if (obj->artifact == (artifact *)0x0) {
    strnfmt(tmp_val,0x50,"0");
  }
  else {
    strnfmt(tmp_val,0x50,"%s",obj->artifact->name);
  }
  _Var5 = get_string("Enter new artifact: ",tmp_val,0x50);
  if (!_Var5) goto LAB_00135ca3;
  _Var5 = get_int_from_string(tmp_val,&val);
  if (_Var5) {
    if ((0 < (long)val) && ((uint)val < (uint)z_info->a_max)) {
      art = a_info + val;
      goto LAB_001359c9;
    }
    obj->artifact = (artifact *)0x0;
  }
  else {
    art = lookup_artifact_name(tmp_val);
LAB_001359c9:
    obj->artifact = art;
    if (art != (artifact *)0x0) {
      poVar3 = obj->known;
      uVar2 = obj->oidx;
      lVar4 = obj->grid;
      bVar1 = obj->notice;
      obj->ego = (ego_item *)0x0;
      local_e8 = obj->prev;
      poStack_e0 = obj->next;
      object_prep(obj,obj->kind,art->alloc_min,RANDOMISE);
      obj->artifact = art;
      obj->prev = local_e8;
      obj->next = poStack_e0;
      obj->known = poVar3;
      obj->oidx = uVar2;
      obj->grid = lVar4;
      obj->notice = bVar1;
      copy_artifact_data(obj,art);
    }
  }
  wiz_display_item(obj,true,player);
  ppcVar9 = do_cmd_wiz_tweak_item::obj_mods;
  for (lVar8 = 0; lVar8 != 0x11; lVar8 = lVar8 + 1) {
    strnfmt(prompt,0x50,"Enter new %s setting: ",*ppcVar9);
    strnfmt(tmp_val,0x50,"%d",(ulong)(uint)(int)obj->modifiers[lVar8]);
    _Var5 = get_string(prompt,tmp_val,0x50);
    if (!_Var5) goto LAB_00135ca3;
    _Var5 = get_int_from_string(tmp_val,&val);
    if (_Var5) {
      obj->modifiers[lVar8] = (int16_t)val;
      wiz_display_item(obj,true,player);
    }
    ppcVar9 = ppcVar9 + 1;
  }
  strnfmt(prompt,0x50,"Enter new %s setting: ","AC bonus");
  strnfmt(tmp_val,0x50,"%d",(ulong)(uint)(int)obj->to_a);
  _Var5 = get_string(prompt,tmp_val,0x50);
  if (_Var5) {
    _Var5 = get_int_from_string(tmp_val,&val);
    if (_Var5) {
      obj->to_a = (int16_t)val;
      wiz_display_item(obj,true,player);
    }
    strnfmt(prompt,0x50,"Enter new %s setting: ","to-hit");
    strnfmt(tmp_val,0x50,"%d",(ulong)(uint)(int)obj->to_h);
    _Var5 = get_string(prompt,tmp_val,0x50);
    if (_Var5) {
      _Var5 = get_int_from_string(tmp_val,&val);
      if (_Var5) {
        obj->to_h = (int16_t)val;
        wiz_display_item(obj,true,player);
      }
      strnfmt(prompt,0x50,"Enter new %s setting: ","to-dam");
      strnfmt(tmp_val,0x50,"%d",(ulong)(uint)(int)obj->to_d);
      _Var5 = get_string(prompt,tmp_val,0x50);
      if ((_Var5) && (_Var5 = get_int_from_string(tmp_val,&val), _Var5)) {
        obj->to_d = (int16_t)val;
        wiz_display_item(obj,true,player);
      }
    }
  }
LAB_00135ca3:
  if (update == L'\0') {
    wiz_play_item_notify_changed();
  }
  else {
    wiz_play_item_standard_upkeep(player,obj);
  }
  return;
}

Assistant:

void do_cmd_wiz_tweak_item(struct command *cmd)
{
	static const char *obj_mods[] = {
		#define STAT(a) #a,
		#include "list-stats.h"
		#undef STAT
		#define OBJ_MOD(a) #a,
		#include "list-object-modifiers.h"
		#undef OBJ_MOD
		NULL
	};
	struct object *obj;
	char tmp_val[80];
	int i, val;
	int update = 0;

	/* Get the item to tweak. */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) {
		if (!get_item(&obj, "Tweak which item? ",
				"You have nothing to tweak.", cmd->code,
				NULL, (USE_EQUIP | USE_INVEN | USE_QUIVER |
				USE_FLOOR))) {
			return;
		}
		cmd_set_arg_item(cmd, "item", obj);
	}

	/* Hack -- leave artifacts alone */
	if (obj->artifact) return;

	/*
	 * Check for whether updating the player information or let
	 * do_cmd_wiz_play_item() handle it.
	 */
	if (cmd_get_arg_choice(cmd, "update", &update) != CMD_OK) {
		update = 1;
	}

	/* Get ego name. */
	if (obj->ego) {
		strnfmt(tmp_val, sizeof(tmp_val), "%s", obj->ego->name);
	} else {
		strnfmt(tmp_val, sizeof(tmp_val), "-1");
	}
	if (!get_string("Enter ego item: ", tmp_val, sizeof(tmp_val))) return;

	/* Accept index or name */
	if (get_int_from_string(tmp_val, &val)) {
		if (val >= 0 && val < z_info->e_max) {
			obj->ego = &e_info[val];
		} else {
			obj->ego = NULL;
		}
	} else {
		obj->ego = lookup_ego_item(tmp_val, obj->tval, obj->sval);
	}
	if (obj->ego) {
		struct ego_item *e = obj->ego;
		struct object *prev = obj->prev;
		struct object *next = obj->next;
		struct object *known = obj->known;
		uint16_t oidx = obj->oidx;
		struct loc grid = obj->grid;
		bitflag notice = obj->notice;

		object_prep(obj, obj->kind, player->depth, RANDOMISE);
		obj->ego = e;
		obj->prev = prev;
		obj->next = next;
		obj->known = known;
		obj->oidx = oidx;
		obj->grid = grid;
		obj->notice = notice;
		ego_apply_magic(obj, player->depth, RANDOMISE);
	}
	wiz_display_item(obj, true, player);

	/* Get artifact name */
	if (obj->artifact) {
		strnfmt(tmp_val, sizeof(tmp_val), "%s", obj->artifact->name);
	} else {
		strnfmt(tmp_val, sizeof(tmp_val), "0");
	}
	if (!get_string("Enter new artifact: ", tmp_val, sizeof(tmp_val))) {
		if (update) {
			wiz_play_item_standard_upkeep(player, obj);
		} else {
			wiz_play_item_notify_changed();
		}
		return;
	}

	/* Accept index or name */
	if (get_int_from_string(tmp_val, &val)) {
		if (val > 0 && val < z_info->a_max) {
			obj->artifact = &a_info[val];
		} else {
			obj->artifact = NULL;
		}
	} else {
		obj->artifact = lookup_artifact_name(tmp_val);
	}
	if (obj->artifact) {
		const struct artifact *a = obj->artifact;
		struct object *prev = obj->prev;
		struct object *next = obj->next;
		struct object *known = obj->known;
		uint16_t oidx = obj->oidx;
		struct loc grid = obj->grid;
		bitflag notice = obj->notice;

		obj->ego = NULL;
		object_prep(obj, obj->kind, obj->artifact->alloc_min, RANDOMISE);
		obj->artifact = a;
		obj->prev = prev;
		obj->next = next;
		obj->known = known;
		obj->oidx = oidx;
		obj->grid = grid;
		obj->notice = notice;
		copy_artifact_data(obj, obj->artifact);
	}
	wiz_display_item(obj, true, player);

#define WIZ_TWEAK(attribute, name) do {\
		char prompt[80];\
		strnfmt(prompt, sizeof(prompt), "Enter new %s setting: ", name);\
		strnfmt(tmp_val, sizeof(tmp_val), "%d", obj->attribute);\
		if (!get_string(prompt, tmp_val, sizeof(tmp_val))) {\
			if (update) {\
				wiz_play_item_standard_upkeep(player, obj);\
			} else {\
				wiz_play_item_notify_changed();\
			}\
			return;\
		}\
		if (get_int_from_string(tmp_val, &val)) {\
			obj->attribute = val;\
			wiz_display_item(obj, true, player);\
		}\
} while (0)
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		WIZ_TWEAK(modifiers[i], obj_mods[i]);
	}
	WIZ_TWEAK(to_a, "AC bonus");
	WIZ_TWEAK(to_h, "to-hit");
	WIZ_TWEAK(to_d, "to-dam");

	if (update) {
		wiz_play_item_standard_upkeep(player, obj);
	} else {
		wiz_play_item_notify_changed();
	}
}